

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

QStringList * __thiscall
QtPrivate::QStringList_filter
          (QStringList *__return_storage_ptr__,QtPrivate *this,QStringList *that,QStringView str,
          CaseSensitivity cs)

{
  qsizetype qVar1;
  QString *s;
  QString *args;
  long lVar2;
  QStringView haystack0;
  QStringView needle0;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(this + 0x10) != 0) {
    args = *(QString **)(this + 8);
    lVar2 = *(long *)(this + 0x10) * 0x18;
    do {
      haystack0.m_data = (args->d).ptr;
      haystack0.m_size = (args->d).size;
      needle0.m_data = (storage_type_conflict *)str.m_size;
      needle0.m_size = (qsizetype)that;
      qVar1 = findString(haystack0,0,needle0,(CaseSensitivity)str.m_data);
      if (qVar1 != -1) {
        QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,args);
        QList<QString>::end(__return_storage_ptr__);
      }
      args = args + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, QStringView str,
                                          Qt::CaseSensitivity cs)
{
    return filter_helper(*that, str, cs);
}